

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintPrototypeSyntax,slang::syntax::ConstraintPrototypeSyntax_const&>
          (BumpAllocator *this,ConstraintPrototypeSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  ConstraintPrototypeSyntax *pCVar9;
  
  pCVar9 = (ConstraintPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintPrototypeSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConstraintPrototypeSyntax *)allocateSlow(this,0xe8,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  (pCVar9->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0388;
  uVar4 = *(undefined4 *)&(args->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pCVar9->qualifiers).super_SyntaxListBase.childCount =
       (args->qualifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar9->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0988;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pCVar9->keyword).kind = (args->keyword).kind;
  (pCVar9->keyword).field_0x2 = uVar5;
  (pCVar9->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar9->keyword).rawLen = uVar7;
  (pCVar9->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->specifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pCVar9->specifiers).super_SyntaxListBase.childCount =
       (args->specifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->specifiers).
           super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar9->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pCVar9->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0ce0;
  TVar8 = (args->semi).kind;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  (pCVar9->name).ptr = (args->name).ptr;
  (pCVar9->semi).kind = TVar8;
  (pCVar9->semi).field_0x2 = uVar5;
  (pCVar9->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar9->semi).rawLen = uVar7;
  (pCVar9->semi).info = (args->semi).info;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }